

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcLaborResource::IfcLaborResource(IfcLaborResource *this)

{
  *(undefined ***)&this->field_0x1b0 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x1b8 = 0;
  *(char **)&this->field_0x1c0 = "IfcLaborResource";
  IfcConstructionResource::IfcConstructionResource
            (&this->super_IfcConstructionResource,&PTR_construction_vtable_24__00791a00);
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x180 = 0;
  *(undefined8 *)&this->super_IfcConstructionResource = 0x7918f8;
  *(undefined8 *)&this->field_0x1b0 = 0x7919e8;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x88 = 0x791920;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x98 = 0x791948;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0xd0 = 0x791970;
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x791998;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x178 = 0x7919c0;
  *(undefined1 **)&(this->super_IfcConstructionResource).field_0x188 = &this->field_0x198;
  *(undefined8 *)&this->field_0x190 = 0;
  this->field_0x198 = 0;
  this->field_0x1a8 = 0;
  return;
}

Assistant:

IfcLaborResource() : Object("IfcLaborResource") {}